

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluatePerseusPolicy.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  byte bVar2;
  ostream *poVar3;
  NullPlanner *this;
  ulong uVar4;
  AgentPOMDP *this_00;
  QAV *pQVar5;
  ulong uVar6;
  AgentBG *this_01;
  undefined8 *puVar7;
  StateDistribution *pSVar8;
  undefined8 in_RSI;
  undefined4 in_EDI;
  double dVar9;
  E *e;
  double Vjb0;
  uint i_1;
  AgentDelayedSharedObservations *agent1_1;
  QAV<PerseusBGPlanner> *Qbg;
  vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
  agents_1;
  uint i;
  QAV<PerseusPOMDPPlanner> *Qpomdp;
  AgentSharedObservations *agent1;
  vector<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_> agents;
  SimulationResult result;
  SimulationDecPOMDPDiscrete sim;
  PlanningUnitDecPOMDPDiscrete *np;
  PlanningUnitMADPDiscreteParameters params;
  size_t horizon;
  stringstream valueFunction;
  DecPOMDPDiscreteInterface *decpomdp;
  QAVParameters qavParams;
  Arguments args;
  SimulationResult *in_stack_fffffffffffff798;
  SimulationResult *in_stack_fffffffffffff7a0;
  value_type *in_stack_fffffffffffff7a8;
  string *in_stack_fffffffffffff7b0;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffff7b8;
  QAV<PerseusBGPlanner> *in_stack_fffffffffffff7c0;
  allocator<char> *in_stack_fffffffffffff7d0;
  char *in_stack_fffffffffffff7d8;
  Arguments *in_stack_fffffffffffff7e0;
  vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
  *in_stack_fffffffffffff8e8;
  SimulationDecPOMDPDiscrete *in_stack_fffffffffffff8f0;
  vector<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_>
  *in_stack_fffffffffffff8f8;
  SimulationDecPOMDPDiscrete *in_stack_fffffffffffff900;
  string local_6f8 [32];
  string local_6d8 [24];
  long local_6c0 [6];
  string local_690 [32];
  string local_670 [24];
  long local_658 [6];
  double local_628;
  SimulationResult local_620 [52];
  uint local_5ec;
  AgentBG *local_5e8;
  undefined1 local_5d9;
  string local_5d8 [32];
  QAV *local_5b8;
  SimulationResult local_598 [48];
  uint local_568;
  undefined1 local_561;
  string local_560 [32];
  QAV *local_540;
  AgentPOMDP *local_538;
  SimulationResult local_518 [48];
  SimulationDecPOMDPDiscrete local_4e8 [80];
  NullPlanner *local_498;
  PlanningUnitMADPDiscreteParameters local_489 [8];
  undefined1 uStack_481;
  ulong local_480;
  undefined1 local_478 [40];
  MultiAgentDecisionProcessInterface local_450 [32];
  string local_430 [32];
  stringstream local_410 [16];
  ostream local_400 [376];
  DecPOMDPDiscreteInterface *local_288;
  undefined1 local_280 [157];
  undefined1 local_1e3;
  GMAA_t local_1e0;
  int local_1d0;
  bool local_1cc;
  int local_130;
  undefined8 local_10;
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  ArgumentHandlers::Arguments::Arguments(in_stack_fffffffffffff7e0);
  argp_parse(ArgumentHandlers::theArgpStruc,local_8,local_10,0,0,local_280 + 0x38);
  Perseus::ProcessArguments((Arguments *)local_280);
  local_1e3 = 1;
  local_288 = (DecPOMDPDiscreteInterface *)
              ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs((Arguments *)(local_280 + 0x38));
  std::__cxx11::stringstream::stringstream(local_410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
  directories::MADPGetResultsFilename
            (local_430,local_450,(Arguments *)(local_288 + *(long *)(*(long *)local_288 + -0x40)));
  poVar3 = std::operator<<(local_400,local_430);
  poVar3 = std::operator<<(poVar3,"Perseus");
  Perseus::BackupTypeToString_abi_cxx11_((QAVParameters *)local_478);
  poVar3 = std::operator<<(poVar3,(string *)local_478);
  std::operator<<(poVar3,"ValueFunction_h");
  std::__cxx11::string::~string((string *)local_478);
  std::__cxx11::string::~string(local_430);
  std::__cxx11::string::~string((string *)local_450);
  std::allocator<char>::~allocator((allocator<char> *)(local_478 + 0x27));
  if ((local_1cc & 1U) == 0) {
    std::ostream::operator<<(local_400,local_1d0);
  }
  else {
    std::ostream::operator<<(local_400,999999);
  }
  if ((local_1cc & 1U) == 0) {
    local_480 = (ulong)local_1d0;
  }
  else {
    local_480 = 999999;
  }
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_489);
  PlanningUnitMADPDiscreteParameters::SetComputeAll((bool)((char)&uStack_481 + -8));
  if (local_1e0 == MAAstar) {
    PlanningUnitMADPDiscreteParameters::SetUseSparseJointBeliefs(local_489,false);
  }
  else {
    PlanningUnitMADPDiscreteParameters::SetUseSparseJointBeliefs(local_489,true);
  }
  bVar2 = (**(code **)(*(long *)(local_288 + *(long *)(*(long *)local_288 + -0xb8)) + 0x140))
                    (local_288 + *(long *)(*(long *)local_288 + -0xb8));
  PlanningUnitMADPDiscreteParameters::SetEventObservability(local_489,(bool)(bVar2 & 1));
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner(this,local_480,local_288,local_489);
  local_498 = this;
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
            (local_4e8,(PlanningUnitDecPOMDPDiscrete *)this,(Arguments *)(local_280 + 0x38));
  SimulationResult::SimulationResult(local_518);
  if (local_130 == 0) {
    std::vector<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_>::vector
              ((vector<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_> *)
               0x10c79a);
    pQVar5 = (QAV *)operator_new(0x38);
    local_561 = 1;
    std::__cxx11::stringstream::str();
    QAV<PerseusPOMDPPlanner>::QAV
              ((QAV<PerseusPOMDPPlanner> *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
               in_stack_fffffffffffff7b0);
    local_561 = 0;
    std::__cxx11::string::~string(local_560);
    local_568 = 0;
    local_540 = pQVar5;
    while( true ) {
      uVar4 = (ulong)local_568;
      uVar6 = (**(code **)(*(long *)(local_288 + *(long *)(*(long *)local_288 + -0x40)) + 0x10))
                        (local_288 + *(long *)(*(long *)local_288 + -0x40));
      if (uVar4 == uVar6) break;
      this_00 = (AgentPOMDP *)operator_new(0x38);
      AgentPOMDP::AgentPOMDP(this_00,(PlanningUnitDecPOMDPDiscrete *)local_498,0,local_540);
      local_538 = this_00;
      (**(code **)(*(long *)this_00 + 0x18))(this_00,local_568);
      std::vector<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_>::push_back
                ((vector<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_> *)
                 in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
      local_568 = local_568 + 1;
    }
    SimulationDecPOMDPDiscrete::RunSimulations<AgentSharedObservations>
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
    SimulationResult::operator=(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    SimulationResult::~SimulationResult(local_598);
    std::vector<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_>::~vector
              ((vector<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_> *)
               in_stack_fffffffffffff7b0);
  }
  else {
    if (local_130 != 1) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = "PerseusBackupType is unknown";
      __cxa_throw(puVar7,&char_const*::typeinfo,0);
    }
    std::vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
    ::vector((vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
              *)0x10ca3b);
    pQVar5 = (QAV *)operator_new(0x38);
    local_5d9 = 1;
    std::__cxx11::stringstream::str();
    QAV<PerseusBGPlanner>::QAV
              (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
    local_5d9 = 0;
    std::__cxx11::string::~string(local_5d8);
    local_5ec = 0;
    local_5b8 = pQVar5;
    while( true ) {
      uVar4 = (ulong)local_5ec;
      uVar6 = (**(code **)(*(long *)(local_288 + *(long *)(*(long *)local_288 + -0x40)) + 0x10))
                        (local_288 + *(long *)(*(long *)local_288 + -0x40));
      if (uVar4 == uVar6) break;
      this_01 = (AgentBG *)operator_new(0x100);
      AgentBG::AgentBG(this_01,(PlanningUnitDecPOMDPDiscrete *)local_498,0,local_5b8);
      local_5e8 = this_01;
      (**(code **)(*(long *)this_01 + 0x18))(this_01,local_5ec);
      std::
      vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>::
      push_back((vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
                 *)in_stack_fffffffffffff7b0,(value_type *)in_stack_fffffffffffff7a8);
      local_5ec = local_5ec + 1;
    }
    SimulationDecPOMDPDiscrete::RunSimulations<AgentDelayedSharedObservations>
              (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    SimulationResult::operator=(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    SimulationResult::~SimulationResult(local_620);
    std::vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
    ::~vector((vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
               *)in_stack_fffffffffffff7b0);
  }
  if ((local_280[0x1c] & 1) == 0) {
    pSVar8 = (StateDistribution *)
             (**(code **)(*(long *)(local_288 + *(long *)(*(long *)local_288 + -0xb8)) + 0x50))
                       (local_288 + *(long *)(*(long *)local_288 + -0xb8));
    JointBelief::JointBelief((JointBelief *)local_6c0,pSVar8);
    lVar1 = *(long *)(local_6c0[0] + -0xb8);
    std::__cxx11::stringstream::str();
    uVar4 = local_480;
    uVar6 = (**(code **)(*(long *)(local_288 + *(long *)(*(long *)local_288 + -0xb8)) + 0x68))
                      (local_288 + *(long *)(*(long *)local_288 + -0xb8));
    (**(code **)(*(long *)(local_288 + *(long *)(*(long *)local_288 + -0xb8)) + 0x30))
              (local_288 + *(long *)(*(long *)local_288 + -0xb8));
    AlphaVectorPlanning::ImportValueFunction(local_6d8,(ulong)local_6f8,uVar4,uVar6);
    local_628 = (double)BeliefValue::GetValue
                                  ((BeliefInterface *)((long)local_6c0 + lVar1),(vector *)local_6d8,
                                   0);
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               *)in_stack_fffffffffffff7b0);
    std::__cxx11::string::~string(local_6f8);
    JointBelief::~JointBelief((JointBelief *)local_6c0);
  }
  else {
    pSVar8 = (StateDistribution *)
             (**(code **)(*(long *)(local_288 + *(long *)(*(long *)local_288 + -0xb8)) + 0x50))
                       (local_288 + *(long *)(*(long *)local_288 + -0xb8));
    JointBelief::JointBelief((JointBelief *)local_658,pSVar8);
    lVar1 = *(long *)(local_658[0] + -0xb8);
    std::__cxx11::stringstream::str();
    AlphaVectorPlanning::ImportValueFunction(local_670);
    local_628 = (double)BeliefValue::GetValue
                                  ((BeliefInterface *)((long)local_658 + lVar1),(vector *)local_670)
    ;
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff7b0);
    std::__cxx11::string::~string(local_690);
    JointBelief::~JointBelief((JointBelief *)local_658);
  }
  if ((int)local_280._56_4_ < 0) {
    dVar9 = SimulationResult::GetAvgReward(local_518);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar9);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_628);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Empirical control quality (h ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_480);
    poVar3 = std::operator<<(poVar3," backup ");
    Perseus::BackupTypeToString_abi_cxx11_((QAVParameters *)&stack0xfffffffffffff8e8);
    poVar3 = std::operator<<(poVar3,(string *)&stack0xfffffffffffff8e8);
    poVar3 = std::operator<<(poVar3," V(jb0) ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_628);
    poVar3 = std::operator<<(poVar3,") = ");
    dVar9 = SimulationResult::GetAvgReward(local_518);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff8e8);
  }
  SimulationResult::~SimulationResult(local_518);
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete(local_4e8);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_489);
  std::__cxx11::stringstream::~stringstream(local_410);
  ArgumentHandlers::Arguments::~Arguments((Arguments *)0x10d237);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    try {

    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    QAVParameters qavParams=Perseus::ProcessArguments(args);

    // this is necessary for running Perseus on TOI models
    args.cache_flat_models=true;

    DecPOMDPDiscreteInterface* decpomdp;
    decpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);

    stringstream valueFunction;
    valueFunction << directories::MADPGetResultsFilename("POMDP",*decpomdp,args)
                  << "Perseus"
                  << Perseus::BackupTypeToString(qavParams) 
                  << "ValueFunction_h";
    if(args.infiniteHorizon)
        valueFunction << MAXHORIZON;
    else
        valueFunction << args.horizon;

    size_t horizon;
    if(!args.infiniteHorizon)
    {
        horizon=args.horizon;
//         if(qavParams.stationary && !args.isTOI)
//             decpomdp->ConvertFiniteToInfiniteHorizon(horizon);
    }
    else
        horizon=MAXHORIZON;
   

    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(false);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);

    params.SetEventObservability(decpomdp->GetEventObservability());

    PlanningUnitDecPOMDPDiscrete *np=new NullPlanner(horizon,decpomdp, &params);

    SimulationDecPOMDPDiscrete sim(*np,args);
    SimulationResult result;

    switch(args.backup)
    {
    case POMDP:
    {
        vector<AgentSharedObservations*> agents;
        AgentSharedObservations *agent1;
        QAV<PerseusPOMDPPlanner> *Qpomdp=
            new QAV<PerseusPOMDPPlanner>(np,valueFunction.str());
        for(unsigned int i=0;i!=decpomdp->GetNrAgents();++i)
        {
            agent1=new AgentPOMDP(np,0,Qpomdp);
            agent1->SetIndex(i);
            agents.push_back(agent1);
        }
        result=sim.RunSimulations(agents);
        break;
    }
    case BG:
    {
        vector<AgentDelayedSharedObservations*> agents;
        QAV<PerseusBGPlanner> *Qbg=
            new QAV<PerseusBGPlanner>(np,valueFunction.str());
        AgentDelayedSharedObservations *agent1;
        for(unsigned int i=0;i!=decpomdp->GetNrAgents();++i)
        {
            agent1=new AgentBG(np,0,Qbg);
            agent1->SetIndex(i);
            agents.push_back(agent1);
        }
        result=sim.RunSimulations(agents);
        break;
    }
    default:
        throw("PerseusBackupType is unknown");
    }

    double Vjb0;
    if(qavParams.stationary)
        Vjb0=
            BeliefValue::GetValue(JointBelief(*decpomdp->GetISD()),
                                  AlphaVectorPlanning::
                                  ImportValueFunction(valueFunction.str()));
    else
    {
        Vjb0=
            BeliefValue::GetValue(JointBelief(*decpomdp->GetISD()),
                                  AlphaVectorPlanning::
                                  ImportValueFunction(valueFunction.str(),
                                                      horizon, decpomdp->
                                                      GetNrJointActions(),
                                                      decpomdp->
                                                      GetNrStates()),
                                  0);
    }
    if(args.verbose < 0)
        cout << result.GetAvgReward() << " " << Vjb0 << endl;
    else
    {
        cout << "Empirical control quality (h " << horizon << " backup "
             << Perseus::BackupTypeToString(qavParams)
             << " V(jb0) " << Vjb0 << ") = " << result.GetAvgReward() << endl;
    }

    }
    catch(E& e){ e.Print(); }

    return(0);
}